

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_physical_device_features(StateRecorder *this,void *device_pnext)

{
  bool bVar1;
  Hash HVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  void *device_pnext_local;
  StateRecorder *this_local;
  
  lock._M_device = (mutex_type *)device_pnext;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->impl->record_lock);
  bVar1 = Impl::copy_physical_device_features
                    (this->impl,lock._M_device,&this->impl->allocator,
                     &this->impl->physical_device_features);
  if (bVar1) {
    HVar2 = Hashing::compute_hash_physical_device_features(this->impl->physical_device_features);
    (this->impl->application_feature_hash).physical_device_features_hash = HVar2;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return bVar1;
}

Assistant:

bool StateRecorder::record_physical_device_features(const void *device_pnext)
{
	// We just ignore pNext, but it's okay to keep it. We will not need to serialize it for now.
	std::lock_guard<std::mutex> lock(impl->record_lock);
	if (!impl->copy_physical_device_features(device_pnext, impl->allocator, &impl->physical_device_features))
		return false;
	impl->application_feature_hash.physical_device_features_hash =
			Hashing::compute_hash_physical_device_features(impl->physical_device_features);
	return true;
}